

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyResourceState(RESOURCE_STATE States,COMMAND_QUEUE_TYPE QueueType,char *Name)

{
  COMMAND_QUEUE_TYPE CVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  char cVar4;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE Type_00;
  COMMAND_QUEUE_TYPE Type_01;
  undefined7 in_register_00000031;
  COMMAND_QUEUE_TYPE CVar5;
  RESOURCE_STATE State;
  bool bVar6;
  bool bVar7;
  string msg;
  undefined5 in_stack_ffffffffffffff78;
  string local_80;
  Char *local_60;
  String local_58;
  undefined4 local_34;
  
  if (States == RESOURCE_STATE_UNKNOWN) {
    bVar2 = true;
  }
  else {
    local_34 = (undefined4)CONCAT71(in_register_00000031,QueueType);
    CVar5 = QueueType & COMMAND_QUEUE_TYPE_GRAPHICS;
    bVar6 = Name != (char *)0x0;
    CVar3 = QueueType & COMMAND_QUEUE_TYPE_COMPUTE;
    cVar4 = CVar3 == COMMAND_QUEUE_TYPE_COMPUTE || bVar6;
    CVar1 = bVar6 | QueueType;
    bVar2 = true;
    do {
      State = -States & States;
      if (0x7ff < (int)State) {
        if ((int)State < 0x10000) {
          if ((int)State < 0x2000) {
            if ((State == RESOURCE_STATE_COPY_DEST) || (State == RESOURCE_STATE_COPY_SOURCE))
            goto switchD_00675489_caseD_1;
          }
          else if ((State == RESOURCE_STATE_RESOLVE_DEST) ||
                  ((State == RESOURCE_STATE_RESOLVE_SOURCE ||
                   (State == RESOURCE_STATE_INPUT_ATTACHMENT)))) goto switchD_00675489_caseD_2;
          goto switchD_00675489_caseD_3;
        }
        if ((int)State < 0x80000) {
          if (State != RESOURCE_STATE_PRESENT) {
            if ((State != RESOURCE_STATE_BUILD_AS_READ) && (State != RESOURCE_STATE_BUILD_AS_WRITE))
            goto switchD_00675489_caseD_3;
            goto switchD_00675489_caseD_4;
          }
        }
        else {
          if (State == RESOURCE_STATE_RAY_TRACING) goto switchD_00675489_caseD_4;
          if (State != RESOURCE_STATE_MAX_BIT) {
            if (State == RESOURCE_STATE_COMMON) goto switchD_00675489_caseD_1;
            goto switchD_00675489_caseD_3;
          }
        }
        goto switchD_00675489_caseD_2;
      }
      if (0x3f < (int)State) {
        if (0xff < (int)State) {
          if (State != RESOURCE_STATE_SHADER_RESOURCE) {
            if (State == RESOURCE_STATE_STREAM_OUT) goto switchD_00675489_caseD_2;
            if (State != RESOURCE_STATE_INDIRECT_ARGUMENT) goto switchD_00675489_caseD_3;
          }
          goto switchD_00675489_caseD_4;
        }
        if ((State != RESOURCE_STATE_DEPTH_WRITE) && (State != RESOURCE_STATE_DEPTH_READ))
        goto switchD_00675489_caseD_3;
        goto switchD_00675489_caseD_2;
      }
      switch(State) {
      case RESOURCE_STATE_UNDEFINED:
switchD_00675489_caseD_1:
        if ((CVar1 & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_UNKNOWN) {
          bVar2 = (bool)(bVar2 & (byte)local_34);
          break;
        }
        local_60 = GetResourceStateFlagString(State);
        GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar5,Type_01);
        FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                  (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                   (char **)" that is not supported in ",(char (*) [27])&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x825c14,
                   (char (*) [9])
                   CONCAT17(CVar3,CONCAT16(cVar4,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"VerifyResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x177);
        goto LAB_0067574d;
      case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
      case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
switchD_00675489_caseD_3:
        FormatString<char[26]>(&local_80,(char (*) [26])"Unexpected resource state");
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"VerifyResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x19c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        break;
      case RESOURCE_STATE_CONSTANT_BUFFER:
switchD_00675489_caseD_4:
        bVar7 = CVar3 == COMMAND_QUEUE_TYPE_COMPUTE;
        if (cVar4 == '\0') {
          local_60 = GetResourceStateFlagString(State);
          GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar5,Type);
          FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                    (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                     (char **)" that is not supported in ",(char (*) [27])&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x825c14,
                     (char (*) [9])
                     CONCAT17(CVar3,CONCAT16(cVar4,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          DebugAssertionFailed
                    (local_80._M_dataplus._M_p,"VerifyResourceState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x185);
          goto LAB_0067574d;
        }
        goto LAB_00675627;
      default:
        if (State != RESOURCE_STATE_RENDER_TARGET) {
          if (State == RESOURCE_STATE_UNORDERED_ACCESS) goto switchD_00675489_caseD_4;
          goto switchD_00675489_caseD_3;
        }
      case RESOURCE_STATE_VERTEX_BUFFER:
      case RESOURCE_STATE_INDEX_BUFFER:
switchD_00675489_caseD_2:
        bVar7 = CVar5 == COMMAND_QUEUE_TYPE_GRAPHICS;
        if (CVar5 == COMMAND_QUEUE_TYPE_GRAPHICS || bVar6) {
LAB_00675627:
          bVar2 = (bool)(bVar7 & bVar2);
        }
        else {
          local_60 = GetResourceStateFlagString(State);
          GetCommandQueueTypeString_abi_cxx11_(&local_58,(Diligent *)(ulong)CVar5,Type_00);
          FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                    (&local_80,(Diligent *)" contains state ",(char (*) [17])&local_60,
                     (char **)" that is not supported in ",(char (*) [27])&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x825c14,
                     (char (*) [9])
                     CONCAT17(CVar3,CONCAT16(cVar4,CONCAT15(CVar1,in_stack_ffffffffffffff78))));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          DebugAssertionFailed
                    (local_80._M_dataplus._M_p,"VerifyResourceState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x197);
LAB_0067574d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
      }
      bVar7 = State != States;
      States = State ^ States;
    } while (bVar7);
  }
  return bVar2;
}

Assistant:

bool VerifyResourceState(RESOURCE_STATE States, COMMAND_QUEUE_TYPE QueueType, const char* Name)
{
    QueueType &= COMMAND_QUEUE_TYPE_PRIMARY_MASK;

    bool Result = true;
    while (States != 0)
    {
        RESOURCE_STATE State = ExtractLSB(States);

        static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update the switch below to handle the new resource state");
        switch (State)
        {
            case RESOURCE_STATE_UNDEFINED:
            case RESOURCE_STATE_COPY_DEST:
            case RESOURCE_STATE_COPY_SOURCE:
            case RESOURCE_STATE_COMMON:
                if ((QueueType & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_TRANSFER)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_CONSTANT_BUFFER:
            case RESOURCE_STATE_UNORDERED_ACCESS:
            case RESOURCE_STATE_SHADER_RESOURCE:
            case RESOURCE_STATE_INDIRECT_ARGUMENT:
            case RESOURCE_STATE_BUILD_AS_READ:
            case RESOURCE_STATE_BUILD_AS_WRITE:
            case RESOURCE_STATE_RAY_TRACING:
                if ((QueueType & COMMAND_QUEUE_TYPE_COMPUTE) != COMMAND_QUEUE_TYPE_COMPUTE)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_VERTEX_BUFFER:
            case RESOURCE_STATE_INDEX_BUFFER:
            case RESOURCE_STATE_RENDER_TARGET:
            case RESOURCE_STATE_DEPTH_WRITE:
            case RESOURCE_STATE_DEPTH_READ:
            case RESOURCE_STATE_STREAM_OUT:
            case RESOURCE_STATE_RESOLVE_DEST:
            case RESOURCE_STATE_RESOLVE_SOURCE:
            case RESOURCE_STATE_INPUT_ATTACHMENT:
            case RESOURCE_STATE_PRESENT:
            case RESOURCE_STATE_SHADING_RATE:
                if ((QueueType & COMMAND_QUEUE_TYPE_GRAPHICS) != COMMAND_QUEUE_TYPE_GRAPHICS)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            default:
                UNEXPECTED("Unexpected resource state");
                break;
        }
    }
    return Result;
}